

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O0

void __thiscall NDeviceChannel::NDeviceChannel(NDeviceChannel *this)

{
  NetworkDataType *in_RDI;
  
  NetworkDataType::NetworkDataType(in_RDI);
  in_RDI->_vptr_NetworkDataType = (_func_int **)&PTR__NDeviceChannel_005d61f8;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"");
  *(undefined4 *)&in_RDI[5]._vptr_NetworkDataType = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[5]._vptr_NetworkDataType + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[6]._vptr_NetworkDataType = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[6]._vptr_NetworkDataType + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[7]._vptr_NetworkDataType = 0xffffffff;
  return;
}

Assistant:

NDeviceChannel::NDeviceChannel() : NetworkDataType() {
    id = "";
    startByte = -1;
    startBit = -1;
    type = -1;
    interleavedDataByte = -1;
    interleavedDataBit = -1;
}